

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

mir_llong get_arr_type_size(type *arr_type)

{
  node_t pnVar1;
  byte *pbVar2;
  int iVar3;
  mir_llong mVar4;
  
  if (arr_type->mode == TM_ARR) {
    pnVar1 = (((arr_type->u).tag_type)->op_link).next;
    mVar4 = -1;
    if ((pnVar1->code != N_IGNORE) && (pbVar2 = (byte *)pnVar1->attr, (*pbVar2 & 1) != 0)) {
      iVar3 = integer_type_p(*(type **)(pbVar2 + 0x18));
      if (iVar3 != 0) {
        mVar4 = *(mir_llong *)(pbVar2 + 0x30);
      }
    }
    return mVar4;
  }
  __assert_fail("arr_type->mode == TM_ARR",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x1de3,"mir_llong get_arr_type_size(struct type *)");
}

Assistant:

static mir_llong get_arr_type_size (struct type *arr_type) {
  node_t size_node;
  struct expr *sexpr;

  assert (arr_type->mode == TM_ARR);
  size_node = arr_type->u.arr_type->size;
  sexpr = size_node->attr;
  return (size_node->code != N_IGNORE && sexpr->const_p && integer_type_p (sexpr->type)
            ? sexpr->c.i_val
            : -1);
}